

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cpu_instr_sbc(gb_cpu_t *cpu,uint8_t value)

{
  byte bVar1;
  uint uVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  
  uVar2._0_2_ = cpu->field_0;
  uVar2._2_2_ = cpu->field_1;
  uVar5 = uVar2 >> 4 & 1;
  bVar1 = (cpu->field_0).field_0.reg_a;
  uVar6 = (uint)CONCAT71(in_register_00000031,value);
  iVar4 = (bVar1 - uVar6) - uVar5;
  uVar3 = (uint8_t)iVar4;
  (cpu->field_0).field_0.reg_f =
       (byte)((uint)iVar4 >> 0x1b) & 0x10 |
       ((bVar1 & 0xf) < (uVar6 & 0xf) + uVar5) << 5 | (byte)(undefined2)uVar2 & 0xf |
       (uVar3 == '\0') << 7 | 0x40;
  (cpu->field_0).field_0.reg_a = uVar3;
  return;
}

Assistant:

static inline void cpu_instr_sbc(gb_cpu_t *cpu, uint8_t value)
{
    int carry = GET_C();
    int result = cpu->reg_a - value - carry;

    SET_Z(ZERO_CHECK(result));
    SET_N(1);
    SET_H((cpu->reg_a & 0xF) - (value & 0xF) - carry < 0);
    SET_C(result < 0);

    cpu->reg_a = result;
}